

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

UnblindParameter *
cfd::core::ConfidentialTransaction::CalculateUnblindIssueData
          (UnblindParameter *__return_storage_ptr__,Privkey *blinding_key,ByteData *rangeproof,
          ConfidentialValue *value_commitment,Script *extra,ConfidentialAssetId *asset)

{
  bool bVar1;
  CfdException *pCVar2;
  Amount AVar3;
  ConfidentialAssetId local_188;
  int ret;
  undefined1 local_158 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty_factor;
  uint64_t value_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> extra_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> abf_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> generator;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbf_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commitment_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rangeproof_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nonce_bytes;
  
  Privkey::GetData((ByteData *)&local_188,blinding_key);
  ByteData::GetBytes(&nonce_bytes,(ByteData *)&local_188);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
  ByteData::GetBytes(&rangeproof_bytes,rangeproof);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,
             &(value_commitment->data_).data_);
  ByteData::GetBytes(&commitment_bytes,(ByteData *)&local_188);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
  extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Script::IsEmpty(extra);
  if (!bVar1) {
    Script::GetData((ByteData *)&empty_factor,extra);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,
                       (ByteData *)&empty_factor);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&extra_bytes,&local_188);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_factor,0x20,
             (allocator_type *)&local_188);
  memset(empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,0,
         (long)empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  ConfidentialAssetId::GetUnblindedData((ByteData *)&local_188,asset);
  ByteData::GetBytes(&asset_bytes,(ByteData *)&local_188);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&generator,0x21,
             (allocator_type *)&local_188);
  ret = wally_asset_generator_from_bytes
                  (asset_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)asset_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)asset_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                   empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)empty_factor.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)empty_factor.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                   generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&abf_out,0x20,
               (allocator_type *)&local_188);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&vbf_out,0x20,
               (allocator_type *)&local_188);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset_out,0x20,
               (allocator_type *)&local_188);
    value_out = 0;
    ret = wally_asset_unblind_with_nonce
                    (nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)nonce_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)nonce_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     rangeproof_bytes.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)rangeproof_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)rangeproof_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     commitment_bytes.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)commitment_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)commitment_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)extra_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)extra_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)generator.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)generator.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)asset_out.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)asset_out.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                     vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start,&value_out);
    if (ret == 0) {
      UnblindParameter::UnblindParameter(__return_storage_ptr__);
      ByteData::ByteData((ByteData *)local_158,&asset_out);
      ConfidentialAssetId::ConfidentialAssetId(&local_188,(ByteData *)local_158);
      ConfidentialAssetId::operator=(&__return_storage_ptr__->asset,&local_188);
      ConfidentialAssetId::~ConfidentialAssetId(&local_188);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
      ByteData256::ByteData256((ByteData256 *)local_158,&abf_out);
      BlindFactor::BlindFactor((BlindFactor *)&local_188,(ByteData256 *)local_158);
      BlindFactor::operator=(&__return_storage_ptr__->abf,(BlindFactor *)&local_188);
      BlindFactor::~BlindFactor((BlindFactor *)&local_188);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
      ByteData256::ByteData256((ByteData256 *)local_158,&vbf_out);
      BlindFactor::BlindFactor((BlindFactor *)&local_188,(ByteData256 *)local_158);
      BlindFactor::operator=(&__return_storage_ptr__->vbf,(BlindFactor *)&local_188);
      BlindFactor::~BlindFactor((BlindFactor *)&local_188);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
      AVar3 = Amount::CreateBySatoshiAmount(value_out);
      local_158._0_8_ = AVar3.amount_;
      local_158[8] = AVar3.ignore_check_;
      ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_188,(Amount *)local_158);
      ConfidentialValue::operator=(&__return_storage_ptr__->value,(ConfidentialValue *)&local_188);
      ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&local_188);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&asset_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&commitment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                );
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&rangeproof_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                );
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return __return_storage_ptr__;
    }
    local_188._vptr_ConfidentialAssetId = (_func_int **)0x231217;
    local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0xbcd;
    local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CalculateUnblindIssueData";
    logger::warn<int&>((CfdSourceLocation *)&local_188,"wally_asset_unblind_with_nonce NG[{}].",&ret
                      );
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&local_188,"unblind confidential data error.",(allocator *)local_158);
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&local_188);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_188._vptr_ConfidentialAssetId = (_func_int **)0x231217;
  local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xbbd;
  local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "CalculateUnblindIssueData";
  logger::warn<int&>((CfdSourceLocation *)&local_188,"wally_asset_generator_from_bytes NG[{}].",&ret
                    );
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_188,"asset generator error.",(allocator *)&abf_out);
  CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&local_188);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

UnblindParameter ConfidentialTransaction::CalculateUnblindIssueData(
    const Privkey &blinding_key, const ByteData &rangeproof,
    const ConfidentialValue &value_commitment, const Script &extra,
    const ConfidentialAssetId &asset) {
  int ret;
  const std::vector<uint8_t> nonce_bytes = blinding_key.GetData().GetBytes();
  const std::vector<uint8_t> rangeproof_bytes = rangeproof.GetBytes();
  const std::vector<uint8_t> commitment_bytes =
      value_commitment.GetData().GetBytes();
  std::vector<uint8_t> extra_bytes;
  if (!extra.IsEmpty()) {
    extra_bytes = extra.GetData().GetBytes();
  }

  std::vector<uint8_t> empty_factor(kBlindFactorSize);
  memset(empty_factor.data(), 0, empty_factor.size());
  const std::vector<uint8_t> asset_bytes = asset.GetUnblindedData().GetBytes();
  std::vector<uint8_t> generator(ASSET_GENERATOR_LEN);
  ret = wally_asset_generator_from_bytes(
      asset_bytes.data(), asset_bytes.size(), empty_factor.data(),
      empty_factor.size(), generator.data(), generator.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_generator_from_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "asset generator error.");
  }

  std::vector<uint8_t> abf_out(kBlindFactorSize);
  std::vector<uint8_t> vbf_out(kBlindFactorSize);
  std::vector<uint8_t> asset_out(kAssetSize);
  uint64_t value_out = 0;
  ret = wally_asset_unblind_with_nonce(
      nonce_bytes.data(), nonce_bytes.size(), rangeproof_bytes.data(),
      rangeproof_bytes.size(), commitment_bytes.data(),
      commitment_bytes.size(), extra_bytes.data(), extra_bytes.size(),
      generator.data(), generator.size(), asset_out.data(), asset_out.size(),
      abf_out.data(), abf_out.size(), vbf_out.data(), vbf_out.size(),
      &value_out);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_unblind_with_nonce NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "unblind confidential data error.");
  }

  UnblindParameter result;
  result.asset = ConfidentialAssetId(asset_out);
  result.abf = BlindFactor(ByteData256(abf_out));
  result.vbf = BlindFactor(ByteData256(vbf_out));
  result.value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_out));
  return result;
}